

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_DRBG.c
# Opt level: O0

_Bool instantiate_sha2_512
                (EverCrypt_DRBG_state_s *st,uint8_t *personalization_string,
                uint32_t personalization_string_len)

{
  undefined8 uVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  long lVar4;
  long lVar5;
  uint8_t *puVar6;
  _Bool _Var7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint uVar10;
  uint len;
  uint8_t *__src;
  ulong uVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  uint8_t *puVar17;
  uint8_t auStack_110 [8];
  uint8_t *local_108;
  uint8_t *local_100;
  uint8_t *local_f8;
  uint8_t *local_f0;
  uint8_t *local_e8;
  uint8_t *k_0;
  unsigned_long __vla_expr3;
  uint local_cc;
  uint8_t *puStack_c8;
  uint32_t input_len0;
  uint8_t *k_;
  unsigned_long __vla_expr2;
  uint32_t *puStack_b0;
  uint32_t input_len;
  uint32_t *ctr;
  uint8_t *v;
  uint8_t *k;
  Hacl_HMAC_DRBG_state scrut;
  unsigned_long __vla_expr1;
  EverCrypt_DRBG_state_s st_s;
  uint8_t *nonce;
  uint8_t *entropy_input;
  _Bool ok;
  unsigned_long __vla_expr0;
  uint32_t min_entropy;
  uint32_t nonce_len;
  uint32_t entropy_input_len;
  uint32_t personalization_string_len_local;
  uint8_t *personalization_string_local;
  EverCrypt_DRBG_state_s *st_local;
  
  if (Hacl_HMAC_DRBG_max_personalization_string_length < personalization_string_len) {
    st_local._7_1_ = false;
  }
  else {
    auStack_110[0] = 'w';
    auStack_110[1] = 0xa6;
    auStack_110[2] = '(';
    auStack_110[3] = '\0';
    auStack_110[4] = '\0';
    auStack_110[5] = '\0';
    auStack_110[6] = '\0';
    auStack_110[7] = '\0';
    uVar8 = Hacl_HMAC_DRBG_min_length('\x03');
    auStack_110[0] = 0x84;
    auStack_110[1] = 0xa6;
    auStack_110[2] = '(';
    auStack_110[3] = '\0';
    auStack_110[4] = '\0';
    auStack_110[5] = '\0';
    auStack_110[6] = '\0';
    auStack_110[7] = '\0';
    uVar9 = Hacl_HMAC_DRBG_min_length('\x03');
    uVar10 = uVar9 >> 1;
    len = uVar8 + uVar10;
    lVar4 = -((ulong)len + 0xf & 0xfffffffffffffff0);
    puVar17 = (uint8_t *)((long)&local_108 + lVar4);
    puVar12 = auStack_110 + lVar4;
    local_f0 = puVar17;
    puVar12[0] = 0xfa;
    puVar12[1] = 0xa6;
    puVar12[2] = '(';
    puVar12[3] = '\0';
    puVar12[4] = '\0';
    puVar12[5] = '\0';
    puVar12[6] = '\0';
    puVar12[7] = '\0';
    memset(puVar17,0,(ulong)len);
    puVar15 = local_f0;
    puVar13 = auStack_110 + lVar4;
    puVar13[0] = '\t';
    puVar13[1] = 0xa7;
    puVar13[2] = '(';
    puVar13[3] = '\0';
    puVar13[4] = '\0';
    puVar13[5] = '\0';
    puVar13[6] = '\0';
    puVar13[7] = '\0';
    _Var7 = Lib_RandomBuffer_System_randombytes(puVar15,len);
    puVar15 = local_f0;
    if (_Var7) {
      __src = local_f0 + uVar8;
      uVar1 = *(undefined8 *)st;
      puVar16 = (st->field_1).case_SHA1_s.k;
      puVar2 = (uint32_t *)(st->field_1).case_SHA1_s.v;
      puVar3 = (st->field_1).case_SHA1_s.reseed_counter;
      scrut.reseed_counter = (uint32_t *)(ulong)(uVar8 + uVar10 + personalization_string_len);
      lVar4 = -((long)scrut.reseed_counter + 0xfU & 0xfffffffffffffff0);
      puVar14 = puVar17 + lVar4;
      local_f8 = puVar14;
      builtin_memcpy(puVar17 + lVar4 + -8,"٧(",4);
      puVar14[-4] = '\0';
      puVar14[-3] = '\0';
      puVar14[-2] = '\0';
      puVar14[-1] = '\0';
      memset(puVar14,0,(ulong)(uVar8 + uVar10 + personalization_string_len));
      puVar6 = local_f8;
      puVar14[-8] = 0xf2;
      puVar14[-7] = 0xa7;
      puVar14[-6] = '(';
      puVar14[-5] = '\0';
      puVar14[-4] = '\0';
      puVar14[-3] = '\0';
      puVar14[-2] = '\0';
      puVar14[-1] = '\0';
      memcpy(puVar6,puVar15,(ulong)uVar8);
      puVar15 = local_f8 + uVar8;
      puVar14[-8] = '\x11';
      puVar14[-7] = 0xa8;
      puVar14[-6] = '(';
      puVar14[-5] = '\0';
      puVar14[-4] = '\0';
      puVar14[-3] = '\0';
      puVar14[-2] = '\0';
      puVar14[-1] = '\0';
      memcpy(puVar15,__src,(ulong)uVar10);
      puVar15 = local_f8 + (ulong)uVar10 + (ulong)uVar8;
      puVar14[-8] = '6';
      puVar14[-7] = 0xa8;
      puVar14[-6] = '(';
      puVar14[-5] = '\0';
      puVar14[-4] = '\0';
      puVar14[-3] = '\0';
      puVar14[-2] = '\0';
      puVar14[-1] = '\0';
      memcpy(puVar15,personalization_string,(ulong)personalization_string_len);
      __vla_expr1._0_1_ = (char)uVar1;
      if ((char)__vla_expr1 != '\x03') {
        puVar14[-8] = 0x80;
        puVar14[-7] = 0xa8;
        puVar14[-6] = '(';
        puVar14[-5] = '\0';
        puVar14[-4] = '\0';
        puVar14[-3] = '\0';
        puVar14[-2] = '\0';
        puVar14[-1] = '\0';
        printf("KaRaMeL abort at %s:%d\n%s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_DRBG.c"
               ,0x220,"unreachable (pattern matches are exhaustive in F*)");
        puVar14[-8] = 0x8a;
        puVar14[-7] = 0xa8;
        puVar14[-6] = '(';
        puVar14[-5] = '\0';
        puVar14[-4] = '\0';
        puVar14[-3] = '\0';
        puVar14[-2] = '\0';
        puVar14[-1] = '\0';
        exit(0xff);
      }
      scrut.v = (uint8_t *)puVar3;
      scrut.k = (uint8_t *)puVar2;
      k = puVar16;
      v = puVar16;
      ctr = puVar2;
      puStack_b0 = puVar3;
      builtin_memcpy(puVar17 + lVar4 + -8,"Ĩ(",4);
      puVar14[-4] = '\0';
      puVar14[-3] = '\0';
      puVar14[-2] = '\0';
      puVar14[-1] = '\0';
      memset(puVar16,0,0x40);
      puVar2 = ctr;
      builtin_memcpy(puVar17 + lVar4 + -8,"ڨ(",4);
      puVar14[-4] = '\0';
      puVar14[-3] = '\0';
      puVar14[-2] = '\0';
      puVar14[-1] = '\0';
      memset(puVar2,1,0x40);
      *puStack_b0 = 1;
      __vla_expr2._4_4_ = uVar8 + 0x41 + uVar10 + personalization_string_len;
      k_ = (uint8_t *)(ulong)__vla_expr2._4_4_;
      lVar5 = -((ulong)(k_ + 0xf) & 0xfffffffffffffff0);
      puVar14 = puVar14 + lVar5;
      uVar11 = (ulong)__vla_expr2._4_4_;
      local_100 = puVar14;
      puVar14[-8] = 'h';
      puVar14[-7] = 0xa9;
      puVar14[-6] = '(';
      puVar14[-5] = '\0';
      puVar14[-4] = '\0';
      puVar14[-3] = '\0';
      puVar14[-2] = '\0';
      puVar14[-1] = '\0';
      memset(puVar14,0,uVar11);
      puVar2 = ctr;
      puVar15 = local_100;
      puStack_c8 = local_100;
      puVar14[-8] = 0x8e;
      puVar14[-7] = 0xa9;
      puVar14[-6] = '(';
      puVar14[-5] = '\0';
      puVar14[-4] = '\0';
      puVar14[-3] = '\0';
      puVar14[-2] = '\0';
      puVar14[-1] = '\0';
      memcpy(puVar15,puVar2,0x40);
      puVar15 = local_f8;
      if (uVar8 + uVar10 + personalization_string_len != 0) {
        puVar16 = local_100 + 0x41;
        builtin_memcpy(puVar17 + lVar5 + lVar4 + -8,"ĩ(",4);
        puVar14[-4] = '\0';
        puVar14[-3] = '\0';
        puVar14[-2] = '\0';
        puVar14[-1] = '\0';
        memcpy(puVar16,puVar15,(ulong)(uVar8 + uVar10 + personalization_string_len));
      }
      puVar15 = local_100;
      local_100[0x40] = '\0';
      puVar6 = v;
      uVar9 = __vla_expr2._4_4_;
      puVar16 = puStack_c8;
      puVar14[-8] = 0xee;
      puVar14[-7] = 0xa9;
      puVar14[-6] = '(';
      puVar14[-5] = '\0';
      puVar14[-4] = '\0';
      puVar14[-3] = '\0';
      puVar14[-2] = '\0';
      puVar14[-1] = '\0';
      EverCrypt_HMAC_compute_sha2_512(puVar16,puVar6,0x40,puVar15,uVar9);
      puVar2 = ctr;
      puVar15 = puStack_c8;
      puVar14[-8] = '\x11';
      puVar14[-7] = 0xaa;
      puVar14[-6] = '(';
      puVar14[-5] = '\0';
      puVar14[-4] = '\0';
      puVar14[-3] = '\0';
      puVar14[-2] = '\0';
      puVar14[-1] = '\0';
      EverCrypt_HMAC_compute_sha2_512((uint8_t *)puVar2,puVar15,0x40,(uint8_t *)puVar2,0x40);
      puVar16 = v;
      puVar15 = puStack_c8;
      puVar14[-8] = ')';
      puVar14[-7] = 0xaa;
      puVar14[-6] = '(';
      puVar14[-5] = '\0';
      puVar14[-4] = '\0';
      puVar14[-3] = '\0';
      puVar14[-2] = '\0';
      puVar14[-1] = '\0';
      memcpy(puVar16,puVar15,0x40);
      if (uVar8 + uVar10 + personalization_string_len != 0) {
        local_cc = uVar8 + 0x41 + uVar10 + personalization_string_len;
        k_0 = (uint8_t *)(ulong)local_cc;
        puVar16 = puVar14 + -((ulong)(k_0 + 0xf) & 0xfffffffffffffff0);
        uVar11 = (ulong)local_cc;
        __vla_expr3 = (unsigned_long)puVar14;
        local_108 = puVar16;
        builtin_memcpy(puVar17 + -((ulong)(k_0 + 0xf) & 0xfffffffffffffff0) + lVar5 + lVar4 + -8,
                       "ƪ(",4);
        puVar16[-4] = '\0';
        puVar16[-3] = '\0';
        puVar16[-2] = '\0';
        puVar16[-1] = '\0';
        memset(puVar16,0,uVar11);
        puVar2 = ctr;
        puVar15 = local_108;
        local_e8 = local_108;
        puVar16[-8] = 0xec;
        puVar16[-7] = 0xaa;
        puVar16[-6] = '(';
        puVar16[-5] = '\0';
        puVar16[-4] = '\0';
        puVar16[-3] = '\0';
        puVar16[-2] = '\0';
        puVar16[-1] = '\0';
        memcpy(puVar15,puVar2,0x40);
        puVar15 = local_f8;
        if (uVar8 + uVar10 + personalization_string_len != 0) {
          puVar17 = local_108 + 0x41;
          puVar16[-8] = '\"';
          puVar16[-7] = 0xab;
          puVar16[-6] = '(';
          puVar16[-5] = '\0';
          puVar16[-4] = '\0';
          puVar16[-3] = '\0';
          puVar16[-2] = '\0';
          puVar16[-1] = '\0';
          memcpy(puVar17,puVar15,(ulong)(uVar8 + uVar10 + personalization_string_len));
        }
        uVar10 = local_cc;
        puVar17 = local_e8;
        puVar15 = local_108;
        local_108[0x40] = '\x01';
        puVar6 = v;
        puVar16[-8] = 'L';
        puVar16[-7] = 0xab;
        puVar16[-6] = '(';
        puVar16[-5] = '\0';
        puVar16[-4] = '\0';
        puVar16[-3] = '\0';
        puVar16[-2] = '\0';
        puVar16[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar17,puVar6,0x40,puVar15,uVar10);
        puVar2 = ctr;
        puVar15 = local_e8;
        puVar16[-8] = 'o';
        puVar16[-7] = 0xab;
        puVar16[-6] = '(';
        puVar16[-5] = '\0';
        puVar16[-4] = '\0';
        puVar16[-3] = '\0';
        puVar16[-2] = '\0';
        puVar16[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512((uint8_t *)puVar2,puVar15,0x40,(uint8_t *)puVar2,0x40);
        puVar17 = v;
        puVar15 = local_e8;
        puVar16[-8] = 0x87;
        puVar16[-7] = 0xab;
        puVar16[-6] = '(';
        puVar16[-5] = '\0';
        puVar16[-4] = '\0';
        puVar16[-3] = '\0';
        puVar16[-2] = '\0';
        puVar16[-1] = '\0';
        memcpy(puVar17,puVar15,0x40);
      }
      st_local._7_1_ = true;
    }
    else {
      st_local._7_1_ = false;
    }
  }
  return st_local._7_1_;
}

Assistant:

static bool
instantiate_sha2_512(
  EverCrypt_DRBG_state_s *st,
  uint8_t *personalization_string,
  uint32_t personalization_string_len
)
{
  if (personalization_string_len > Hacl_HMAC_DRBG_max_personalization_string_length)
  {
    return false;
  }
  uint32_t entropy_input_len = Hacl_HMAC_DRBG_min_length(Spec_Hash_Definitions_SHA2_512);
  uint32_t nonce_len = Hacl_HMAC_DRBG_min_length(Spec_Hash_Definitions_SHA2_512) / 2U;
  uint32_t min_entropy = entropy_input_len + nonce_len;
  KRML_CHECK_SIZE(sizeof (uint8_t), min_entropy);
  uint8_t entropy[min_entropy];
  memset(entropy, 0U, min_entropy * sizeof (uint8_t));
  bool ok = Lib_RandomBuffer_System_randombytes(entropy, min_entropy);
  if (!ok)
  {
    return false;
  }
  uint8_t *entropy_input = entropy;
  uint8_t *nonce = entropy + entropy_input_len;
  EverCrypt_DRBG_state_s st_s = *st;
  KRML_CHECK_SIZE(sizeof (uint8_t), entropy_input_len + nonce_len + personalization_string_len);
  uint8_t seed_material[entropy_input_len + nonce_len + personalization_string_len];
  memset(seed_material,
    0U,
    (entropy_input_len + nonce_len + personalization_string_len) * sizeof (uint8_t));
  memcpy(seed_material, entropy_input, entropy_input_len * sizeof (uint8_t));
  memcpy(seed_material + entropy_input_len, nonce, nonce_len * sizeof (uint8_t));
  memcpy(seed_material + entropy_input_len + nonce_len,
    personalization_string,
    personalization_string_len * sizeof (uint8_t));
  Hacl_HMAC_DRBG_state scrut;
  if (st_s.tag == SHA2_512_s)
  {
    scrut = st_s.case_SHA2_512_s;
  }
  else
  {
    scrut = KRML_EABORT(Hacl_HMAC_DRBG_state, "unreachable (pattern matches are exhaustive in F*)");
  }
  uint8_t *k = scrut.k;
  uint8_t *v = scrut.v;
  uint32_t *ctr = scrut.reseed_counter;
  memset(k, 0U, 64U * sizeof (uint8_t));
  memset(v, 1U, 64U * sizeof (uint8_t));
  ctr[0U] = 1U;
  uint32_t input_len = 65U + entropy_input_len + nonce_len + personalization_string_len;
  KRML_CHECK_SIZE(sizeof (uint8_t), input_len);
  uint8_t input0[input_len];
  memset(input0, 0U, input_len * sizeof (uint8_t));
  uint8_t *k_ = input0;
  memcpy(k_, v, 64U * sizeof (uint8_t));
  if (entropy_input_len + nonce_len + personalization_string_len != 0U)
  {
    memcpy(input0 + 65U,
      seed_material,
      (entropy_input_len + nonce_len + personalization_string_len) * sizeof (uint8_t));
  }
  input0[64U] = 0U;
  EverCrypt_HMAC_compute_sha2_512(k_, k, 64U, input0, input_len);
  EverCrypt_HMAC_compute_sha2_512(v, k_, 64U, v, 64U);
  memcpy(k, k_, 64U * sizeof (uint8_t));
  if (entropy_input_len + nonce_len + personalization_string_len != 0U)
  {
    uint32_t input_len0 = 65U + entropy_input_len + nonce_len + personalization_string_len;
    KRML_CHECK_SIZE(sizeof (uint8_t), input_len0);
    uint8_t input[input_len0];
    memset(input, 0U, input_len0 * sizeof (uint8_t));
    uint8_t *k_0 = input;
    memcpy(k_0, v, 64U * sizeof (uint8_t));
    if (entropy_input_len + nonce_len + personalization_string_len != 0U)
    {
      memcpy(input + 65U,
        seed_material,
        (entropy_input_len + nonce_len + personalization_string_len) * sizeof (uint8_t));
    }
    input[64U] = 1U;
    EverCrypt_HMAC_compute_sha2_512(k_0, k, 64U, input, input_len0);
    EverCrypt_HMAC_compute_sha2_512(v, k_0, 64U, v, 64U);
    memcpy(k, k_0, 64U * sizeof (uint8_t));
  }
  return true;
}